

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_socket.cpp
# Opt level: O2

SOCKET Socket_CreateLargeMultiCast(in_addr MyAddress,unsigned_short MyPort,in_addr MultiCastAddress)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  int iTmp;
  undefined1 local_34 [4];
  in_addr_t local_30;
  char local_2c [8];
  ip_mreqn stMreq;
  
  __fd = socket(2,2,0);
  local_2c[0] = '\0';
  local_2c[1] = '\0';
  local_2c[2] = '\0';
  local_2c[3] = '\0';
  local_2c[4] = '\0';
  local_2c[5] = '\0';
  local_2c[6] = '\0';
  local_2c[7] = '\0';
  local_34._0_2_ = 2;
  local_34._2_2_ = MyPort << 8 | MyPort >> 8;
  local_30 = 0;
  iVar1 = bind(__fd,(sockaddr *)local_34,0x10);
  if (iVar1 == -1) {
    pcVar2 = inet_ntoa((in_addr)local_30);
    LogMessage(1,"%s: bind() failed, address %s, port %d",
               "SOCKET Socket_CreateLargeMultiCast(in_addr, unsigned short, in_addr)",pcVar2,
               (ulong)(ushort)(local_34._2_2_ << 8 | (ushort)local_34._2_2_ >> 8));
  }
  else {
    stMreq.imr_multiaddr.s_addr =
         MultiCastAddress.s_addr >> 0x18 | (MultiCastAddress.s_addr & 0xff0000) >> 8 |
         (MultiCastAddress.s_addr & 0xff00) << 8 | MultiCastAddress.s_addr << 0x18;
    stMreq.imr_address.s_addr = 0;
    stMreq.imr_ifindex = 0;
    iVar1 = setsockopt(__fd,0,0x23,&stMreq,0xc);
    if (iVar1 != -1) {
      iTmp = 2;
      iVar1 = setsockopt(__fd,0,0x21,&iTmp,4);
      if (iVar1 == -1) {
        ProcessSocketError();
      }
      setReceiveBufferSize(__fd,0x100000);
      return __fd;
    }
    LogMessage(1,"%s: Joining the multicast group failed",
               "SOCKET Socket_CreateLargeMultiCast(in_addr, unsigned short, in_addr)");
  }
  ProcessSocketError();
  close(__fd);
  return -1;
}

Assistant:

SOCKET Socket_CreateLargeMultiCast(in_addr MyAddress, // not used
                                   unsigned short MyPort,
                                   in_addr MultiCastAddress // standard byte order (not network byte order)
                                   )
{
  SOCKET MySocket;
  int retval;

  // Get a datagram socket

  MySocket = socket(PF_INET, SOCK_DGRAM, 0);

  // "A socket must bind to an address before calling setsockopt"

  struct sockaddr_in my_addr;

  memset(&my_addr, 0, sizeof(my_addr));
  my_addr.sin_family = AF_INET;
  my_addr.sin_port = htons(MyPort);
  //my_addr.sin_addr.s_addr = inet_addr(szMyAddress); //INADDR_ANY;
  my_addr.sin_addr.s_addr = INADDR_ANY;//MyAddress.s_addr;

  if (bind(MySocket, (struct sockaddr *) &my_addr, sizeof(struct sockaddr))
      == SOCKET_ERROR) {
    LogMessage(VL_Error, "%s: bind() failed, address %s, port %d", __PRETTY_FUNCTION__, inet_ntoa(my_addr.sin_addr), ntohs(my_addr.sin_port));
    ProcessSocketError();
    close(MySocket);
    return -1;
  }

  // Join the multicast group
  // Note: This is NOT necessary for the host program.

  struct ip_mreqn stMreq;

  //stMreq.imr_multiaddr.s_addr = inet_addr(szMultiCastAddress);
  //stMreq.imr_interface.s_addr = inet_addr(szMyAddress);
  stMreq.imr_multiaddr.s_addr = htonl(MultiCastAddress.s_addr);
//  stMreq.imr_interface = MyAddress;
  stMreq.imr_address.s_addr = INADDR_ANY;
  stMreq.imr_ifindex = 0;
  retval = setsockopt(MySocket, IPPROTO_IP, IP_ADD_MEMBERSHIP,
                      (char *) &stMreq, sizeof(ip_mreqn));
  if (retval == SOCKET_ERROR) {
    LogMessage(VL_Error, "%s: Joining the multicast group failed", __PRETTY_FUNCTION__);
    ProcessSocketError();
    close(MySocket);
    return -1;
  }

  // Set TTL to traverse multiple routers (test)
  // The default is 1 which means direct connections only.  No routers.

  int iTmp;

  iTmp = 2;
  retval = setsockopt(MySocket, IPPROTO_IP, IP_MULTICAST_TTL, (char *) &iTmp,
                      sizeof(iTmp));
  if (retval == SOCKET_ERROR) {
    ProcessSocketError();
  }

  setReceiveBufferSize(MySocket, 0x100000);

  // Disable loopback
#if 0
  iTmp = 0;
  retval = setsockopt(MySocket, IPPROTO_IP, IP_MULTICAST_LOOP, (char *)&iTmp, sizeof(iTmp));
  if (retval == SOCKET_ERROR)
  {
    ProcessSocketError();
  }
#endif

  // If you want the MultiCast to go out through more than one ethernet card...
#if 0
  unsigned long addr = inet_addr(IP_Address);
  retval = setsockopt(MySocket, IPPROTO_IP, IP_MULTICAST_IF, (char *)&addr, sizeof(addr));
#endif

  // Send and Receive examples

#if 0
  // Configure an address for sendto

  memset(&m_stTo, 0, sizeof(sockaddr_in));
  m_stTo.sin_family = AF_INET;
  m_stTo.sin_addr.s_addr = inet_addr(szMultiCastAddress);
  m_stTo.sin_port = htons(MultiCastPort);
#endif

#if 0
  retval = sendto(MySocket, "multicast message", 20, 0, (struct sockaddr *)&m_stTo, sizeof(m_stTo));

  // Receiving message example

  len = sizeof(stFrom);
  recvfrom(MySocket, achIn, BUFSIZE, 0, (struct sockaddr *)&stFrom, &len);

  // Exit multicast group

  //stMreq.imr_multiaddr.s_addr = inet_addr("224,1,2,4");
  //stMreq.imr_interface.s_addr = netstatic[0].n_ipaddr;

  retval = setsockopt(MySocket, IPPROTO_IP, IP_DROP_MEMBERSHIP, (char *)&stMreq, sizeof(stMreq));

  retval = close(MySocket);
#endif

  return MySocket;
}